

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gui.test.cpp
# Opt level: O0

int main(void)

{
  result_type_conflict rVar1;
  result_type_conflict rVar2;
  result_type_conflict Z;
  int i_2;
  uniform_real_distribution<float> dist;
  mt19937 mersenneRand;
  int i_1;
  int i;
  int states3;
  int states2;
  int states;
  float in_stack_ffffffffffffec08;
  float in_stack_ffffffffffffec0c;
  undefined4 in_stack_ffffffffffffec10;
  result_type_conflict in_stack_ffffffffffffec14;
  undefined4 in_stack_ffffffffffffec18;
  undefined4 in_stack_ffffffffffffec1c;
  undefined4 in_stack_ffffffffffffec20;
  float in_stack_ffffffffffffec24;
  Vector3<float> local_13d0;
  int local_13c4;
  Vector3f *in_stack_ffffffffffffed00;
  Vector3<float> local_30;
  int local_24;
  Vector3<float> local_20;
  int local_14;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_8 = 6;
  local_c = 0x24;
  local_10 = 0xd8;
  std::operator<<((ostream *)&std::cout,"\ntestRgbToHsv()\n");
  for (local_14 = 0; local_14 < 0xd8; local_14 = local_14 + 1) {
    sf::Vector3<float>::Vector3
              (&local_20,
               (float)(int)((long)((ulong)(uint)((int)((long)local_14 / 0x24) >> 0x1f) << 0x20 |
                                  (long)local_14 / 0x24 & 0xffffffffU) % 6) / 5.0,
               (float)(int)((long)((ulong)(uint)((int)((long)local_14 / 6) >> 0x1f) << 0x20 |
                                  (long)local_14 / 6 & 0xffffffffU) % 6) / 5.0,
               (float)(local_14 % 6) / 5.0);
    testRgbToHsv(in_stack_ffffffffffffed00);
  }
  std::operator<<((ostream *)&std::cout,"\ntestHsvToRgb()\n");
  for (local_24 = 0; local_24 < 0xd8; local_24 = local_24 + 1) {
    sf::Vector3<float>::Vector3
              (&local_30,
               (float)(int)((long)((ulong)(uint)((int)((long)local_24 / 0x24) >> 0x1f) << 0x20 |
                                  (long)local_24 / 0x24 & 0xffffffffU) % 6) / 5.0,
               (float)(int)((long)((ulong)(uint)((int)((long)local_24 / 6) >> 0x1f) << 0x20 |
                                  (long)local_24 / 6 & 0xffffffffU) % 6) / 5.0,
               (float)(local_24 % 6) / 5.0);
    testHsvToRgb(in_stack_ffffffffffffed00);
  }
  std::operator<<((ostream *)&std::cout,"\ntest random samples\n");
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x102738);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)CONCAT44(in_stack_ffffffffffffec24,in_stack_ffffffffffffec20),
         CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18));
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)
             CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),in_stack_ffffffffffffec0c
             ,in_stack_ffffffffffffec08);
  for (local_13c4 = 0; local_13c4 < 100; local_13c4 = local_13c4 + 1) {
    rVar1 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)
                       CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
    in_stack_ffffffffffffec14 =
         std::uniform_real_distribution<float>::operator()
                   ((uniform_real_distribution<float> *)
                    CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
                    (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
    rVar2 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)
                       CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
    sf::Vector3<float>::Vector3(&local_13d0,rVar1,in_stack_ffffffffffffec14,rVar2);
    testRgbToHsv(in_stack_ffffffffffffed00);
    rVar1 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)
                       CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
    rVar2 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)
                       CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
    Z = std::uniform_real_distribution<float>::operator()
                  ((uniform_real_distribution<float> *)
                   CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
                   (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                    *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
    sf::Vector3<float>::Vector3((Vector3<float> *)&stack0xffffffffffffec24,rVar1,rVar2,Z);
    testHsvToRgb(in_stack_ffffffffffffed00);
  }
  return 0;
}

Assistant:

int main() {
    constexpr int states = 6, states2 = states * states, states3 = states2 * states;
    std::cout << "\ntestRgbToHsv()\n";
    for (int i = 0; i < states3; ++i) {
        testRgbToHsv({
            static_cast<float>(i / states2 % states) / (states - 1),
            static_cast<float>(i / states % states) / (states - 1),
            static_cast<float>(i % states) / (states - 1)
        });
    }
    std::cout << "\ntestHsvToRgb()\n";
    for (int i = 0; i < states3; ++i) {
        testHsvToRgb({
            static_cast<float>(i / states2 % states) / (states - 1),
            static_cast<float>(i / states % states) / (states - 1),
            static_cast<float>(i % states) / (states - 1)
        });
    }
    std::cout << "\ntest random samples\n";
    std::mt19937 mersenneRand;
    mersenneRand.seed(123);
    std::uniform_real_distribution<float> dist(0.0f, 1.0f);
    for (int i = 0; i < 100; ++i) {
        testRgbToHsv({dist(mersenneRand), dist(mersenneRand), dist(mersenneRand)});
        testHsvToRgb({dist(mersenneRand), dist(mersenneRand), dist(mersenneRand)});
    }

    return 0;
}